

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O0

void __thiscall
Eigen::
HouseholderSequence<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,-1,true>,Eigen::VectorBlock<Eigen::Matrix<float,-1,1,0,-1,1>const,-1>,1>
::applyThisOnTheLeft<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,1,1,1,1,1>>
          (HouseholderSequence<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,true>,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>const,_1>,1>
           *this,Matrix<float,__1,_1,_0,__1,_1> *dst,Matrix<float,_1,_1,_1,_1,_1> *workspace,
          bool inputIsIdentity)

{
  PlainObjectBase<Eigen::Matrix<float,_1,_1,_1,_1,_1>_> *this_00;
  Matrix<float,_1,_1,_1,_1,_1> *pMVar1;
  Index IVar2;
  long *plVar3;
  long blockCols;
  Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true> *xpr;
  Index IVar4;
  long lVar5;
  long blockRows;
  Scalar *tau;
  Scalar *workspace_00;
  long local_2e8;
  long local_2d0;
  Index local_2b8;
  Index local_2a0;
  long local_268;
  long local_260;
  long local_258;
  EssentialVectorType local_248;
  Type local_1e0;
  long local_1a8;
  Index dstStart_1;
  Index actual_k;
  Index k_1;
  undefined1 local_128 [8];
  Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false> sub_dst;
  Index dstRows;
  Index dstStart;
  type sub_vecs;
  SubVectorsType sub_vecs1;
  Index start;
  Index bs;
  long local_58;
  long local_50;
  Index k;
  long local_40;
  Index end;
  Index i;
  Index blockSize;
  PlainObjectBase<Eigen::Matrix<float,_1,_1,_1,_1,_1>_> *pPStack_20;
  bool inputIsIdentity_local;
  Matrix<float,_1,_1,_1,_1,_1> *workspace_local;
  Matrix<float,__1,_1,_0,__1,_1> *dst_local;
  HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1>,_1>
  *this_local;
  
  blockSize._7_1_ = inputIsIdentity;
  if ((inputIsIdentity) && (((byte)this[0x70] & 1) != 0)) {
    blockSize._7_1_ = 0;
  }
  pPStack_20 = &workspace->super_PlainObjectBase<Eigen::Matrix<float,_1,_1,_1,_1,_1>_>;
  workspace_local = (Matrix<float,_1,_1,_1,_1,_1> *)dst;
  dst_local = (Matrix<float,__1,_1,_0,__1,_1> *)this;
  if ((*(long *)(this + 0x78) < 0x30) ||
     (IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::cols
                        (&dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>),
     IVar2 < 2)) {
    this_00 = pPStack_20;
    IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)workspace_local);
    PlainObjectBase<Eigen::Matrix<float,_1,_1,_1,_1,_1>_>::resize(this_00,IVar2);
    for (actual_k = 0; actual_k < *(long *)(this + 0x78); actual_k = actual_k + 1) {
      if (((byte)this[0x70] & 1) == 0) {
        local_2d0 = (*(long *)(this + 0x78) - actual_k) + -1;
      }
      else {
        local_2d0 = actual_k;
      }
      dstStart_1 = local_2d0;
      IVar2 = HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1>,_1>
              ::rows((HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1>,_1>
                      *)this);
      pMVar1 = workspace_local;
      lVar5 = (IVar2 - *(long *)(this + 0x80)) - dstStart_1;
      local_2e8 = lVar5;
      local_1a8 = lVar5;
      if ((blockSize._7_1_ & 1) == 0) {
        local_2e8 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::cols
                              ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)
                               workspace_local);
      }
      DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::bottomRightCorner<long,long>
                (&local_1e0,(DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)pMVar1,lVar5,local_2e8);
      HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1>,_1>
      ::essentialVector(&local_248,
                        (HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1>,_1>
                         *)this,dstStart_1);
      tau = MapBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>::
            coeff((MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                   *)(this + 0x38),dstStart_1);
      workspace_00 = PlainObjectBase<Eigen::Matrix<float,_1,_1,_1,_1,_1>_>::data(pPStack_20);
      MatrixBase<Eigen::Block<Eigen::Matrix<float,-1,1,0,-1,1>,-1,-1,false>>::
      applyHouseholderOnTheLeft<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,true>const,_1,1,false>>
                ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>> *)
                 &local_1e0,&local_248,tau,workspace_00);
    }
  }
  else {
    if (*(long *)(this + 0x78) < 0x60) {
      local_258 = (*(long *)(this + 0x78) + 1) / 2;
    }
    else {
      local_258 = 0x30;
    }
    i = local_258;
    for (end = 0; end < *(long *)(this + 0x78); end = i + end) {
      if (((byte)this[0x70] & 1) == 0) {
        local_260 = *(long *)(this + 0x78) - end;
      }
      else {
        k = end + i;
        plVar3 = std::min<long>((long *)(this + 0x78),&k);
        local_260 = *plVar3;
      }
      local_40 = local_260;
      if (((byte)this[0x70] & 1) == 0) {
        local_58 = 0;
        bs = local_260 - i;
        plVar3 = std::max<long>(&local_58,&bs);
        local_268 = *plVar3;
      }
      else {
        local_268 = end;
      }
      local_50 = local_268;
      blockCols = local_40 - local_268;
      sub_vecs1.
      super_BlockImpl<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_true>
      .m_outerStride = local_268 + *(long *)(this + 0x80);
      xpr = EigenBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>_>::
            const_cast_derived((EigenBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>_>
                                *)this);
      lVar5 = local_50;
      IVar2 = sub_vecs1.
              super_BlockImpl<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_true>
              .m_outerStride;
      IVar4 = MapBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_0>
              ::rows((MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>
                      *)this);
      Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>
      ::Block((Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>
               *)&sub_vecs,xpr,IVar2,lVar5,
              IVar4 - sub_vecs1.
                      super_BlockImpl<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_true>
                      .m_outerStride,blockCols);
      IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)workspace_local)
      ;
      IVar4 = HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1>,_1>
              ::rows((HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1>,_1>
                      *)this);
      lVar5 = (IVar2 - IVar4) + *(long *)(this + 0x80) + local_50;
      IVar2 = HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1>,_1>
              ::rows((HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1>,_1>
                      *)this);
      pMVar1 = workspace_local;
      blockRows = (IVar2 - *(long *)(this + 0x80)) - local_50;
      local_2a0 = lVar5;
      if ((blockSize._7_1_ & 1) == 0) {
        local_2a0 = 0;
      }
      local_2b8 = blockRows;
      sub_dst.super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
      m_outerStride = blockRows;
      if ((blockSize._7_1_ & 1) == 0) {
        local_2b8 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::cols
                              ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)
                               workspace_local);
      }
      Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false> *)local_128,
                 (Matrix<float,__1,_1,_0,__1,_1> *)pMVar1,lVar5,local_2a0,blockRows,local_2b8);
      DenseBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::
      segment<long>((Type *)&k_1,
                    (DenseBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                     *)(this + 0x38),local_50,blockCols);
      internal::
      apply_block_householder_on_the_left<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,true>,_1,_1,false>,Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>const,_1,1,false>const,_1>>
                ((Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false> *)local_128,
                 (Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>
                  *)&sub_vecs,
                 (VectorBlock<const_Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,__1>
                  *)&k_1,(bool)(((byte)this[0x70] ^ 0xff) & 1));
    }
  }
  return;
}

Assistant:

inline void applyThisOnTheLeft(Dest& dst, Workspace& workspace, bool inputIsIdentity = false) const
    {
      if(inputIsIdentity && m_reverse)
        inputIsIdentity = false;
      // if the entries are large enough, then apply the reflectors by block
      if(m_length>=BlockSize && dst.cols()>1)
      {
        // Make sure we have at least 2 useful blocks, otherwise it is point-less:
        Index blockSize = m_length<Index(2*BlockSize) ? (m_length+1)/2 : Index(BlockSize);
        for(Index i = 0; i < m_length; i+=blockSize)
        {
          Index end = m_reverse ? (std::min)(m_length,i+blockSize) : m_length-i;
          Index k = m_reverse ? i : (std::max)(Index(0),end-blockSize);
          Index bs = end-k;
          Index start = k + m_shift;

          typedef Block<typename internal::remove_all<VectorsType>::type,Dynamic,Dynamic> SubVectorsType;
          SubVectorsType sub_vecs1(m_vectors.const_cast_derived(), Side==OnTheRight ? k : start,
                                                                   Side==OnTheRight ? start : k,
                                                                   Side==OnTheRight ? bs : m_vectors.rows()-start,
                                                                   Side==OnTheRight ? m_vectors.cols()-start : bs);
          typename internal::conditional<Side==OnTheRight, Transpose<SubVectorsType>, SubVectorsType&>::type sub_vecs(sub_vecs1);

          Index dstStart = dst.rows()-rows()+m_shift+k;
          Index dstRows  = rows()-m_shift-k;
          Block<Dest,Dynamic,Dynamic> sub_dst(dst,
                                              dstStart,
                                              inputIsIdentity ? dstStart : 0,
                                              dstRows,
                                              inputIsIdentity ? dstRows : dst.cols());
          apply_block_householder_on_the_left(sub_dst, sub_vecs, m_coeffs.segment(k, bs), !m_reverse);
        }
      }
      else
      {
        workspace.resize(dst.cols());
        for(Index k = 0; k < m_length; ++k)
        {
          Index actual_k = m_reverse ? k : m_length-k-1;
          Index dstStart = rows()-m_shift-actual_k;
          dst.bottomRightCorner(dstStart, inputIsIdentity ? dstStart : dst.cols())
            .applyHouseholderOnTheLeft(essentialVector(actual_k), m_coeffs.coeff(actual_k), workspace.data());
        }
      }
    }